

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testresult.cpp
# Opt level: O0

kRunResultAction __thiscall trun::TestResult::CheckIfContinue(TestResult *this)

{
  Config *pCVar1;
  TestResult *this_local;
  
  if (this->testResult == kTestResult_ModuleFail) {
    pCVar1 = Config::Instance();
    if ((pCVar1->skipOnModuleFail & 1U) != 0) {
      return kAbortModule;
    }
  }
  else if ((this->testResult == kTestResult_AllFail) &&
          (pCVar1 = Config::Instance(), (pCVar1->stopOnAllFail & 1U) != 0)) {
    return kAbortAll;
  }
  return kContinue;
}

Assistant:

TestResult::kRunResultAction TestResult::CheckIfContinue() const {
    //auto pLogger = gnilk::Logger::GetLogger("TestResult");

    if (testResult == kTestResult_ModuleFail) {
        if (Config::Instance().skipOnModuleFail) {
            // pLogger->Info("Module test failure, skipping remaining test cases in library");
            return kRunResultAction::kAbortModule;
        } else {
            // pLogger->Info("Module test failure, continue anyway (configuration)");
        }
    } else if (testResult == kTestResult_AllFail) {
        if (Config::Instance().stopOnAllFail) {
            // pLogger->Critical("Total test failure, aborting");
            return kRunResultAction::kAbortAll;
        } else {
            // pLogger->Info("Total test failure, continue anyway (configuration)");
        }
    }
    return kRunResultAction::kContinue;

}